

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O3

void ExtractRotationSampler
               (Asset *asset,string *animId,Ref<glTF2::Buffer> *buffer,aiNodeAnim *nodeChannel,
               float ticksPerSecond,Sampler *sampler)

{
  uint uVar1;
  aiQuatKey *paVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong __n;
  Ref<glTF2::Accessor> RVar6;
  allocator_type local_65;
  float local_64;
  vector<float,_std::allocator<float>_> values;
  vector<float,_std::allocator<float>_> times;
  
  uVar1 = nodeChannel->mNumRotationKeys;
  __n = (ulong)uVar1;
  if (__n != 0) {
    local_64 = ticksPerSecond;
    std::vector<float,_std::allocator<float>_>::vector(&times,__n,(allocator_type *)&values);
    std::vector<float,_std::allocator<float>_>::vector(&values,(ulong)(uVar1 * 4),&local_65);
    lVar4 = 0x14;
    uVar5 = 0;
    do {
      paVar2 = nodeChannel->mRotationKeys;
      *(float *)((long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar5) =
           (float)(*(double *)((long)paVar2 + lVar4 + -0x14) / (double)local_64);
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5 & 0xffffffff] = *(float *)((long)paVar2 + lVar4 + -8);
      iVar3 = (int)uVar5;
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar3 + 1] = *(float *)((long)paVar2 + lVar4 + -4);
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar3 + 2] = *(float *)((long)&paVar2->mTime + lVar4);
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar3 + 3] = *(float *)((long)paVar2 + lVar4 + -0xc);
      lVar4 = lVar4 + 0x18;
      uVar5 = uVar5 + 4;
    } while (__n * 4 - uVar5 != 0);
    RVar6 = ExportData(asset,animId,buffer,
                       (ulong)((long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2 & 0xffffffff,
                       times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,SCALAR,SCALAR,ComponentType_FLOAT,false);
    (sampler->input).vector = RVar6.vector;
    (sampler->input).index = RVar6.index;
    RVar6 = ExportData(asset,animId,buffer,__n,
                       values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,VEC4,VEC4,ComponentType_FLOAT,false);
    (sampler->output).vector = RVar6.vector;
    (sampler->output).index = RVar6.index;
    sampler->interpolation = Interpolation_LINEAR;
    if (values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

inline void ExtractRotationSampler(Asset& asset, std::string& animId, Ref<Buffer>& buffer, const aiNodeAnim* nodeChannel, float ticksPerSecond, Animation::Sampler& sampler)
{
    const unsigned int numKeyframes = nodeChannel->mNumRotationKeys;
    if (numKeyframes == 0) {
        return;
    }

    std::vector<float> times(numKeyframes);
    std::vector<float> values(numKeyframes * 4);
    for (unsigned int i = 0; i < numKeyframes; ++i) {
        const aiQuatKey& key = nodeChannel->mRotationKeys[i];
        // mTime is measured in ticks, but GLTF time is measured in seconds, so convert.
        times[i] = static_cast<float>(key.mTime / ticksPerSecond);
        values[(i * 4) + 0] = key.mValue.x;
        values[(i * 4) + 1] = key.mValue.y;
        values[(i * 4) + 2] = key.mValue.z;
        values[(i * 4) + 3] = key.mValue.w;
    }

    sampler.input = GetSamplerInputRef(asset, animId, buffer, times);
    sampler.output = ExportData(asset, animId, buffer, numKeyframes, &values[0], AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    sampler.interpolation = Interpolation_LINEAR;
}